

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpReg2Int1<Js::OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  int iVar5;
  bool bVar6;
  undefined4 *puVar7;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar5 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar5 - 0xb4U < 2) {
    uVar3 = data->C1;
    uVar2 = data->R0;
    uVar1 = data->R1;
    form = L" R%d = R%d, %d";
  }
  else {
    if (iVar5 != 0xb8) {
      if (iVar5 == 0xdb) {
        DumpReg(data->R0);
        Output::Print(L"= func(");
        DumpReg(data->R1);
        Output::Print(L",");
        DumpI4(data->C1);
        Output::Print(L")");
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x226,"(false)","Unknown OpCode for OpLayoutReg2Int1");
      if (bVar6) {
        *puVar7 = 0;
        return;
      }
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    uVar1 = data->C1;
    uVar2 = data->R0;
    uVar3 = data->R1;
    form = L" R%d = [%d], R%d ";
  }
  Output::Print(form,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3);
  return;
}

Assistant:

void ByteCodeDumper::DumpReg2Int1(OpCode op, const unaligned T* data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
         switch (op)
        {
            case OpCode::LdThis:
            case OpCode::ProfiledLdThis:
                Output::Print(_u(" R%d = R%d, %d"), data->R0, data->R1, data->C1);
                break;
            case OpCode::LdIndexedFrameDisplay:
                Output::Print(_u(" R%d = [%d], R%d "), data->R0, data->C1, data->R1);
                break;
            case OpCode::GetCachedFunc:
                DumpReg(data->R0);
                Output::Print(_u("= func("));
                DumpReg(data->R1);
                Output::Print(_u(","));
                DumpI4(data->C1);
                Output::Print(_u(")"));
                break;
            default:
                AssertMsg(false, "Unknown OpCode for OpLayoutReg2Int1");
                break;
        }
    }